

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_enc.c
# Opt level: O0

WebPEncodingError PutVP8Header(WebPPicture *pic,size_t vp8_size)

{
  int iVar1;
  long in_RDI;
  uint8_t vp8_chunk_hdr [8];
  uint32_t in_stack_ffffffffffffffdc;
  WebPEncodingError local_4;
  
  PutLE32((uint8_t *)0x20385056,in_stack_ffffffffffffffdc);
  iVar1 = (**(code **)(in_RDI + 0x60))(&stack0xffffffffffffffe0,8,in_RDI);
  if (iVar1 == 0) {
    local_4 = VP8_ENC_ERROR_BAD_WRITE;
  }
  else {
    local_4 = VP8_ENC_OK;
  }
  return local_4;
}

Assistant:

static WebPEncodingError PutVP8Header(const WebPPicture* const pic,
                                      size_t vp8_size) {
  uint8_t vp8_chunk_hdr[CHUNK_HEADER_SIZE] = {
    'V', 'P', '8', ' '
  };
  assert(vp8_size == (uint32_t)vp8_size);
  PutLE32(vp8_chunk_hdr + TAG_SIZE, (uint32_t)vp8_size);
  if (!pic->writer(vp8_chunk_hdr, sizeof(vp8_chunk_hdr), pic)) {
    return VP8_ENC_ERROR_BAD_WRITE;
  }
  return VP8_ENC_OK;
}